

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int wherePathSolver(WhereInfo *pWInfo,LogEst nRowEst)

{
  undefined8 *puVar1;
  char cVar2;
  ushort uVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  ulong uVar6;
  ulong uVar7;
  WhereLoop **ppWVar8;
  SrcList *pSVar9;
  byte bVar10;
  i8 iVar11;
  LogEst LVar12;
  short sVar13;
  ushort uVar14;
  LogEst LVar15;
  int iVar16;
  uint uVar17;
  int extraout_EAX;
  WherePath *pWVar18;
  undefined6 extraout_var;
  undefined6 extraout_var_00;
  uint uVar19;
  WhereLoop ***pppWVar20;
  ulong uVar21;
  LogEst *pLVar22;
  undefined4 uVar23;
  ulong uVar24;
  short sVar25;
  long lVar26;
  Parse *pPVar27;
  uint uVar28;
  undefined6 in_register_00000032;
  WhereLoop **ppWVar29;
  ExprList *pOrderBy;
  WherePath *pWVar30;
  ulong uVar31;
  ulong uVar32;
  short sVar33;
  int iVar34;
  WhereLoop *pWVar35;
  Bitmask revMask;
  WherePath *local_e8;
  Bitmask local_d8;
  ulong local_d0;
  ulong local_c8;
  int local_c0;
  uint local_bc;
  ulong local_b8;
  WherePath *local_b0;
  undefined8 local_a8;
  undefined4 local_9c;
  Parse *local_98;
  WhereLoop **local_90;
  ulong local_88;
  WhereInfo *local_80;
  uint local_74;
  uint local_70;
  uint local_6c;
  int local_68;
  int local_64;
  WherePath *local_60;
  ulong local_58;
  LogEst *local_50;
  ulong local_48;
  ulong local_40;
  size_t local_38;
  
  local_a8 = CONCAT62(in_register_00000032,nRowEst);
  local_98 = pWInfo->pParse;
  bVar10 = pWInfo->nLevel;
  uVar31 = (ulong)bVar10;
  uVar32 = 1;
  if (1 < bVar10) {
    uVar32 = (ulong)((uint)(bVar10 != 2) * 5 + 5);
  }
  local_c0 = 0;
  if (nRowEst != 0 && pWInfo->pOrderBy != (ExprList *)0x0) {
    local_c0 = pWInfo->pOrderBy->nExpr;
  }
  iVar34 = (int)uVar32 * 2;
  lVar26 = (long)local_c0;
  pWVar18 = (WherePath *)
            sqlite3DbMallocRawNN
                      (local_98->db,
                       (long)(int)(((uint)bVar10 * 8 + 0x20) * iVar34 + (int)(lVar26 * 2)));
  iVar16 = local_c0;
  if (pWVar18 == (WherePath *)0x0) {
    return 0;
  }
  uVar24 = (ulong)(uint)((int)uVar32 << 5);
  local_e8 = (WherePath *)((long)&pWVar18->maskLoop + uVar24);
  puVar1 = (undefined8 *)((long)&pWVar18->nRow + uVar24);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1 = (undefined8 *)((long)&pWVar18->maskLoop + uVar24);
  *puVar1 = 0;
  puVar1[1] = 0;
  local_90 = (WhereLoop **)((long)&local_e8->maskLoop + uVar24);
  uVar28 = iVar34 + 1;
  pppWVar20 = &pWVar18->aLoop;
  do {
    *pppWVar20 = local_90;
    uVar28 = uVar28 - 1;
    local_90 = (WhereLoop **)((long)local_90 + (ulong)((uint)bVar10 * 8));
    pppWVar20 = pppWVar20 + 4;
  } while (1 < uVar28);
  local_b8 = uVar32;
  if (local_c0 == 0) {
    uVar5 = local_98->nQueryLoop;
    sVar25 = 0x30;
    if ((short)uVar5 < 0x30) {
      sVar25 = uVar5;
    }
    local_90 = (WhereLoop **)0x0;
  }
  else {
    memset(local_90,0,lVar26 * 2);
    uVar4 = local_98->nQueryLoop;
    sVar25 = 0x30;
    if ((short)uVar4 < 0x30) {
      sVar25 = uVar4;
    }
    local_e8->isOrdered = -(bVar10 != 0) | (byte)iVar16;
  }
  local_e8->nRow = sVar25;
  if (uVar31 != 0) {
    local_70 = 2;
    if (2 < (uint)local_b8) {
      local_70 = (uint)local_b8;
    }
    local_74 = (int)local_a8 - 10;
    iVar34 = 1;
    local_88 = 0;
    uVar28 = 0;
    uVar24 = 0;
    uVar32 = 0;
    local_80 = pWInfo;
    local_60 = pWVar18;
    local_58 = uVar31;
    do {
      local_b0 = pWVar18;
      if (iVar34 < 1) {
        uVar31 = 0;
      }
      else {
        local_38 = local_88 * 8;
        local_50 = &pWVar18[1].rUnsorted;
        iVar16 = 0;
        local_6c = (uint)local_88 & 0xffff;
        uVar31 = 0;
        pWVar18 = local_e8;
        local_68 = iVar34;
        do {
          local_64 = iVar16;
          for (pWVar35 = pWInfo->pLoops; pWVar35 != (WhereLoop *)0x0; pWVar35 = pWVar35->pNextLoop)
          {
            uVar6 = pWVar18->maskLoop;
            if ((((pWVar35->prereq & ~uVar6) == 0) &&
                (uVar7 = pWVar35->maskSelf, (uVar7 & uVar6) == 0)) &&
               ((sVar25 = pWVar18->nRow, (pWVar35->wsFlags & 0x4000) == 0 || (2 < sVar25)))) {
              local_bc = (uint)uVar31;
              local_d0 = uVar32;
              local_c8 = uVar24;
              LVar12 = sqlite3LogEstAdd(pWVar35->rSetup,pWVar35->rRun + sVar25);
              sVar13 = sqlite3LogEstAdd(LVar12,pWVar18->rUnsorted);
              sVar25 = sVar25 + pWVar35->nOut;
              bVar10 = pWVar18->isOrdered;
              if ((char)bVar10 < '\0') {
                local_d8 = 0;
                bVar10 = wherePathSatisfiesOrderBy
                                   (pWInfo,pWInfo->pOrderBy,pWVar18,pWInfo->wctrlFlags,(u16)local_6c
                                    ,pWVar35,&local_d8);
              }
              else {
                local_d8 = pWVar18->revLoop;
              }
              iVar34 = local_c0 - (char)bVar10;
              uVar23 = (undefined4)CONCAT62(extraout_var,sVar13);
              if ((iVar34 == 0 || local_c0 < (char)bVar10) || (char)bVar10 < '\0') {
                LVar12 = sVar13 + -2;
              }
              else {
                sVar13 = *(short *)((long)local_90 + (ulong)bVar10 * 2);
                if (sVar13 == 0) {
                  iVar16 = local_80->pSelect->pEList->nExpr;
                  iVar16 = iVar16 + (int)((ulong)((long)(iVar16 + 0x3b) * -0x77777777) >> 0x20) +
                           0x3b;
                  local_9c = uVar23;
                  local_40 = (ulong)bVar10;
                  LVar12 = sqlite3LogEst((long)((iVar16 >> 4) - (iVar16 >> 0x1f)));
                  uVar17 = (int)CONCAT62(extraout_var_00,LVar12) + (int)local_a8;
                  if (bVar10 != 0) {
                    local_48 = (ulong)uVar17;
                    uVar14 = sqlite3LogEst((long)((iVar34 * 100) / local_c0));
                    uVar17 = ((int)local_48 + (uint)uVar14) - 0x42;
                  }
                  sVar33 = (short)uVar17;
                  uVar17 = (uint)local_a8;
                  if ((local_80->wctrlFlags >> 0xe & 1) == 0) {
                    uVar19 = uVar17;
                    if ((local_80->wctrlFlags & 0x100) != 0) {
                      uVar19 = local_74;
                    }
                    if ((short)local_a8 < 0xb) {
                      uVar19 = uVar17;
                    }
                  }
                  else {
                    sVar13 = sVar33 + 0x10;
                    sVar33 = sVar33 + 10;
                    if (bVar10 != 0) {
                      sVar33 = sVar13;
                    }
                    uVar19 = (uint)(ushort)local_80->iLimit;
                    if ((short)local_a8 <= local_80->iLimit) {
                      uVar19 = uVar17;
                    }
                  }
                  if ((short)uVar19 < 0xb) {
                    sVar13 = 0;
                  }
                  else {
                    LVar12 = sqlite3LogEst((ulong)(uVar19 & 0xffff));
                    sVar13 = LVar12 + -0x21;
                  }
                  sVar13 = sVar13 + sVar33;
                  *(short *)((long)local_90 + local_40 * 2) = sVar13;
                  uVar23 = local_9c;
                }
                LVar12 = (LogEst)uVar23;
                LVar15 = sqlite3LogEstAdd(LVar12,sVar13);
                sVar13 = LVar15 + 3;
              }
              pWInfo = local_80;
              uVar31 = (ulong)local_bc;
              iVar34 = (int)local_b8;
              uVar32 = local_d0;
              uVar24 = local_c8;
              if (0 < (int)local_bc) {
                uVar21 = uVar31;
                pWVar30 = local_b0;
                do {
                  if ((pWVar30->maskLoop == (uVar7 | uVar6)) &&
                     (-1 < (char)(pWVar30->isOrdered ^ bVar10))) {
                    if ((pWVar30->rCost < sVar13) ||
                       ((pWVar30->rCost == sVar13 &&
                        ((pWVar30->nRow < sVar25 ||
                         ((pWVar30->nRow == sVar25 && (pWVar30->rUnsorted <= LVar12))))))))
                    goto LAB_0018543c;
                    goto LAB_00185343;
                  }
                  pWVar30 = pWVar30 + 1;
                  uVar17 = (int)uVar21 - 1;
                  uVar21 = (ulong)uVar17;
                } while (uVar17 != 0);
              }
              uVar17 = local_bc;
              if ((int)local_b8 <= (int)local_bc) {
                if (((short)local_c8 < sVar13) ||
                   ((uVar17 = uVar28, sVar13 == (short)local_c8 && ((short)local_d0 <= LVar12))))
                goto LAB_0018543c;
              }
              uVar31 = (ulong)(local_bc + ((int)local_bc < (int)local_b8));
              pWVar30 = local_b0 + (int)uVar17;
LAB_00185343:
              pWVar30->maskLoop = pWVar35->maskSelf | pWVar18->maskLoop;
              pWVar30->revLoop = local_d8;
              pWVar30->nRow = sVar25;
              pWVar30->rCost = sVar13;
              pWVar30->rUnsorted = LVar12;
              pWVar30->isOrdered = bVar10;
              memcpy(pWVar30->aLoop,pWVar18->aLoop,local_38);
              pWVar30->aLoop[local_88] = pWVar35;
              uVar32 = local_d0;
              uVar24 = local_c8;
              if (iVar34 <= (int)uVar31) {
                uVar28 = 0;
                uVar32 = (ulong)(ushort)local_b0->nRow;
                uVar24 = (ulong)(ushort)local_b0->rCost;
                if (1 < (byte)local_58) {
                  uVar28 = 0;
                  uVar17 = 1;
                  pLVar22 = local_50;
                  do {
                    uVar14 = pLVar22[-1];
                    if ((short)(ushort)uVar24 < (short)uVar14) {
                      uVar3 = *pLVar22;
LAB_001853e1:
                      uVar32 = (ulong)uVar3;
                      uVar24 = (ulong)uVar14;
                      uVar28 = uVar17;
                    }
                    else if ((uVar14 == (ushort)uVar24) &&
                            (uVar3 = *pLVar22, (short)uVar32 < (short)uVar3)) goto LAB_001853e1;
                    uVar17 = uVar17 + 1;
                    pLVar22 = pLVar22 + 0x10;
                  } while (local_70 != uVar17);
                }
              }
            }
LAB_0018543c:
          }
          iVar16 = local_64 + 1;
          pWVar18 = pWVar18 + 1;
        } while (iVar16 != local_68);
      }
      pPVar27 = local_98;
      local_88 = local_88 + 1;
      iVar34 = (int)uVar31;
      pWVar18 = local_e8;
      local_e8 = local_b0;
    } while (local_88 != local_58);
    if (iVar34 == 0) {
      sqlite3ErrorMsg(local_98,"no query solution");
      pWVar18 = local_60;
      goto LAB_001856d8;
    }
    if (1 < iVar34) {
      lVar26 = uVar31 - 1;
      pWVar30 = local_b0;
      pWVar18 = local_b0;
      do {
        local_e8 = pWVar18 + 1;
        if (pWVar30->rCost <= pWVar18[1].rCost) {
          local_e8 = pWVar30;
        }
        lVar26 = lVar26 + -1;
        pWVar30 = local_e8;
        pWVar18 = pWVar18 + 1;
      } while (lVar26 != 0);
    }
    pWVar18 = local_60;
    uVar31 = local_58;
    if (local_58 != 0) {
      ppWVar8 = local_e8->aLoop;
      pSVar9 = pWInfo->pTabList;
      ppWVar29 = &pWInfo->a[0].pWLoop;
      uVar32 = 0;
      do {
        pWVar35 = ppWVar8[uVar32];
        *ppWVar29 = pWVar35;
        bVar10 = pWVar35->iTab;
        *(byte *)(ppWVar29 + -4) = bVar10;
        *(int *)((long)ppWVar29 + -0x5c) = pSVar9->a[bVar10].iCursor;
        uVar32 = uVar32 + 1;
        ppWVar29 = ppWVar29 + 0xe;
      } while ((local_58 & 0xffffffff) != uVar32);
    }
  }
  pPVar27 = local_98;
  if (((((pWInfo->wctrlFlags & 0x180) == 0x100) && ((short)local_a8 != 0)) &&
      (pWInfo->eDistinct == '\0')) &&
     (iVar11 = wherePathSatisfiesOrderBy
                         (pWInfo,pWInfo->pResultSet,local_e8,0x80,(short)uVar31 - 1,
                          local_e8->aLoop[uVar31 - 1],&local_d8),
     pWInfo->pResultSet->nExpr == (int)iVar11)) {
    pWInfo->eDistinct = '\x02';
  }
  bVar10 = pWInfo->field_0x44;
  pWInfo->field_0x44 = bVar10 & 0xfb;
  pOrderBy = pWInfo->pOrderBy;
  if (pOrderBy != (ExprList *)0x0) {
    cVar2 = local_e8->isOrdered;
    pWInfo->nOBSat = cVar2;
    uVar14 = pWInfo->wctrlFlags;
    uVar28 = (uint)uVar14;
    if ((char)uVar14 < '\0') {
      if (pOrderBy->nExpr == (int)cVar2) {
        pWInfo->eDistinct = '\x02';
      }
    }
    else {
      pWInfo->revMask = local_e8->revLoop;
      if (cVar2 < '\x01') {
        pWInfo->nOBSat = '\0';
        if (uVar31 != 0) {
          uVar19 = (int)uVar31 - 1;
          uVar17 = local_e8->aLoop[uVar19]->wsFlags;
          if ((~uVar17 & 0x104) != 0 && (uVar17 >> 0xc & 1) == 0) {
            local_d8 = 0;
            iVar11 = wherePathSatisfiesOrderBy
                               (pWInfo,pOrderBy,local_e8,0x800,(u16)uVar19,local_e8->aLoop[uVar19],
                                &local_d8);
            pOrderBy = pWInfo->pOrderBy;
            if (pOrderBy->nExpr == (int)iVar11) {
              pWInfo->field_0x44 = pWInfo->field_0x44 | 4;
              pWInfo->revMask = local_d8;
            }
            uVar28 = (uint)pWInfo->wctrlFlags;
          }
        }
      }
      else if (((uVar14 & 3) != 0 && uVar31 != 0) && cVar2 == '\x01') {
        pWInfo->field_0x44 = bVar10 | 4;
      }
    }
    if ((((uVar28 >> 9 & 1) != 0) && (uVar31 != 0)) && (pOrderBy->nExpr == (int)pWInfo->nOBSat)) {
      local_d8 = 0;
      uVar28 = (int)uVar31 - 1;
      iVar11 = wherePathSatisfiesOrderBy
                         (pWInfo,pOrderBy,local_e8,0,(u16)uVar28,local_e8->aLoop[uVar28],&local_d8);
      if (pWInfo->pOrderBy->nExpr == (int)iVar11) {
        pWInfo->field_0x44 = pWInfo->field_0x44 | 8;
        pWInfo->revMask = local_d8;
      }
    }
  }
  pWInfo->nRowOut = local_e8->nRow;
LAB_001856d8:
  sqlite3DbFreeNN(pPVar27->db,pWVar18);
  return extraout_EAX;
}

Assistant:

static int wherePathSolver(WhereInfo *pWInfo, LogEst nRowEst){
  int mxChoice;             /* Maximum number of simultaneous paths tracked */
  int nLoop;                /* Number of terms in the join */
  Parse *pParse;            /* Parsing context */
  int iLoop;                /* Loop counter over the terms of the join */
  int ii, jj;               /* Loop counters */
  int mxI = 0;              /* Index of next entry to replace */
  int nOrderBy;             /* Number of ORDER BY clause terms */
  LogEst mxCost = 0;        /* Maximum cost of a set of paths */
  LogEst mxUnsorted = 0;    /* Maximum unsorted cost of a set of path */
  int nTo, nFrom;           /* Number of valid entries in aTo[] and aFrom[] */
  WherePath *aFrom;         /* All nFrom paths at the previous level */
  WherePath *aTo;           /* The nTo best paths at the current level */
  WherePath *pFrom;         /* An element of aFrom[] that we are working on */
  WherePath *pTo;           /* An element of aTo[] that we are working on */
  WhereLoop *pWLoop;        /* One of the WhereLoop objects */
  WhereLoop **pX;           /* Used to divy up the pSpace memory */
  LogEst *aSortCost = 0;    /* Sorting and partial sorting costs */
  char *pSpace;             /* Temporary memory used by this routine */
  int nSpace;               /* Bytes of space allocated at pSpace */

  pParse = pWInfo->pParse;
  nLoop = pWInfo->nLevel;
  /* TUNING: For simple queries, only the best path is tracked.
  ** For 2-way joins, the 5 best paths are followed.
  ** For joins of 3 or more tables, track the 10 best paths */
  mxChoice = (nLoop<=1) ? 1 : (nLoop==2 ? 5 : 10);
  assert( nLoop<=pWInfo->pTabList->nSrc );
  WHERETRACE(0x002, ("---- begin solver.  (nRowEst=%d, nQueryLoop=%d)\n",
                     nRowEst, pParse->nQueryLoop));

  /* If nRowEst is zero and there is an ORDER BY clause, ignore it. In this
  ** case the purpose of this call is to estimate the number of rows returned
  ** by the overall query. Once this estimate has been obtained, the caller
  ** will invoke this function a second time, passing the estimate as the
  ** nRowEst parameter.  */
  if( pWInfo->pOrderBy==0 || nRowEst==0 ){
    nOrderBy = 0;
  }else{
    nOrderBy = pWInfo->pOrderBy->nExpr;
  }

  /* Allocate and initialize space for aTo, aFrom and aSortCost[] */
  nSpace = (sizeof(WherePath)+sizeof(WhereLoop*)*nLoop)*mxChoice*2;
  nSpace += sizeof(LogEst) * nOrderBy;
  pSpace = sqlite3StackAllocRawNN(pParse->db, nSpace);
  if( pSpace==0 ) return SQLITE_NOMEM_BKPT;
  aTo = (WherePath*)pSpace;
  aFrom = aTo+mxChoice;
  memset(aFrom, 0, sizeof(aFrom[0]));
  pX = (WhereLoop**)(aFrom+mxChoice);
  for(ii=mxChoice*2, pFrom=aTo; ii>0; ii--, pFrom++, pX += nLoop){
    pFrom->aLoop = pX;
  }
  if( nOrderBy ){
    /* If there is an ORDER BY clause and it is not being ignored, set up
    ** space for the aSortCost[] array. Each element of the aSortCost array
    ** is either zero - meaning it has not yet been initialized - or the
    ** cost of sorting nRowEst rows of data where the first X terms of
    ** the ORDER BY clause are already in order, where X is the array
    ** index.  */
    aSortCost = (LogEst*)pX;
    memset(aSortCost, 0, sizeof(LogEst) * nOrderBy);
  }
  assert( aSortCost==0 || &pSpace[nSpace]==(char*)&aSortCost[nOrderBy] );
  assert( aSortCost!=0 || &pSpace[nSpace]==(char*)pX );

  /* Seed the search with a single WherePath containing zero WhereLoops.
  **
  ** TUNING: Do not let the number of iterations go above 28.  If the cost
  ** of computing an automatic index is not paid back within the first 28
  ** rows, then do not use the automatic index. */
  aFrom[0].nRow = MIN(pParse->nQueryLoop, 48);  assert( 48==sqlite3LogEst(28) );
  nFrom = 1;
  assert( aFrom[0].isOrdered==0 );
  if( nOrderBy ){
    /* If nLoop is zero, then there are no FROM terms in the query. Since
    ** in this case the query may return a maximum of one row, the results
    ** are already in the requested order. Set isOrdered to nOrderBy to
    ** indicate this. Or, if nLoop is greater than zero, set isOrdered to
    ** -1, indicating that the result set may or may not be ordered,
    ** depending on the loops added to the current plan.  */
    aFrom[0].isOrdered = nLoop>0 ? -1 : nOrderBy;
  }

  /* Compute successively longer WherePaths using the previous generation
  ** of WherePaths as the basis for the next.  Keep track of the mxChoice
  ** best paths at each generation */
  for(iLoop=0; iLoop<nLoop; iLoop++){
    nTo = 0;
    for(ii=0, pFrom=aFrom; ii<nFrom; ii++, pFrom++){
      for(pWLoop=pWInfo->pLoops; pWLoop; pWLoop=pWLoop->pNextLoop){
        LogEst nOut;                      /* Rows visited by (pFrom+pWLoop) */
        LogEst rCost;                     /* Cost of path (pFrom+pWLoop) */
        LogEst rUnsorted;                 /* Unsorted cost of (pFrom+pWLoop) */
        i8 isOrdered;                     /* isOrdered for (pFrom+pWLoop) */
        Bitmask maskNew;                  /* Mask of src visited by (..) */
        Bitmask revMask;                  /* Mask of rev-order loops for (..) */

        if( (pWLoop->prereq & ~pFrom->maskLoop)!=0 ) continue;
        if( (pWLoop->maskSelf & pFrom->maskLoop)!=0 ) continue;
        if( (pWLoop->wsFlags & WHERE_AUTO_INDEX)!=0 && pFrom->nRow<3 ){
          /* Do not use an automatic index if the this loop is expected
          ** to run less than 1.25 times.  It is tempting to also exclude
          ** automatic index usage on an outer loop, but sometimes an automatic
          ** index is useful in the outer loop of a correlated subquery. */
          assert( 10==sqlite3LogEst(2) );
          continue;
        }

        /* At this point, pWLoop is a candidate to be the next loop.
        ** Compute its cost */
        rUnsorted = sqlite3LogEstAdd(pWLoop->rSetup,pWLoop->rRun + pFrom->nRow);
        rUnsorted = sqlite3LogEstAdd(rUnsorted, pFrom->rUnsorted);
        nOut = pFrom->nRow + pWLoop->nOut;
        maskNew = pFrom->maskLoop | pWLoop->maskSelf;
        isOrdered = pFrom->isOrdered;
        if( isOrdered<0 ){
          revMask = 0;
          isOrdered = wherePathSatisfiesOrderBy(pWInfo,
                       pWInfo->pOrderBy, pFrom, pWInfo->wctrlFlags,
                       iLoop, pWLoop, &revMask);
        }else{
          revMask = pFrom->revLoop;
        }
        if( isOrdered>=0 && isOrdered<nOrderBy ){
          if( aSortCost[isOrdered]==0 ){
            aSortCost[isOrdered] = whereSortingCost(
                pWInfo, nRowEst, nOrderBy, isOrdered
            );
          }
          /* TUNING:  Add a small extra penalty (3) to sorting as an
          ** extra encouragement to the query planner to select a plan
          ** where the rows emerge in the correct order without any sorting
          ** required. */
          rCost = sqlite3LogEstAdd(rUnsorted, aSortCost[isOrdered]) + 3;

          WHERETRACE(0x002,
              ("---- sort cost=%-3d (%d/%d) increases cost %3d to %-3d\n",
               aSortCost[isOrdered], (nOrderBy-isOrdered), nOrderBy,
               rUnsorted, rCost));
        }else{
          rCost = rUnsorted;
          rUnsorted -= 2;  /* TUNING:  Slight bias in favor of no-sort plans */
        }

        /* Check to see if pWLoop should be added to the set of
        ** mxChoice best-so-far paths.
        **
        ** First look for an existing path among best-so-far paths
        ** that covers the same set of loops and has the same isOrdered
        ** setting as the current path candidate.
        **
        ** The term "((pTo->isOrdered^isOrdered)&0x80)==0" is equivalent
        ** to (pTo->isOrdered==(-1))==(isOrdered==(-1))" for the range
        ** of legal values for isOrdered, -1..64.
        */
        for(jj=0, pTo=aTo; jj<nTo; jj++, pTo++){
          if( pTo->maskLoop==maskNew
           && ((pTo->isOrdered^isOrdered)&0x80)==0
          ){
            testcase( jj==nTo-1 );
            break;
          }
        }
        if( jj>=nTo ){
          /* None of the existing best-so-far paths match the candidate. */
          if( nTo>=mxChoice
           && (rCost>mxCost || (rCost==mxCost && rUnsorted>=mxUnsorted))
          ){
            /* The current candidate is no better than any of the mxChoice
            ** paths currently in the best-so-far buffer.  So discard
            ** this candidate as not viable. */
#ifdef WHERETRACE_ENABLED /* 0x4 */
            if( sqlite3WhereTrace&0x4 ){
              sqlite3DebugPrintf("Skip   %s cost=%-3d,%3d,%3d order=%c\n",
                  wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsorted,
                  isOrdered>=0 ? isOrdered+'0' : '?');
            }
#endif
            continue;
          }
          /* If we reach this points it means that the new candidate path
          ** needs to be added to the set of best-so-far paths. */
          if( nTo<mxChoice ){
            /* Increase the size of the aTo set by one */
            jj = nTo++;
          }else{
            /* New path replaces the prior worst to keep count below mxChoice */
            jj = mxI;
          }
          pTo = &aTo[jj];
#ifdef WHERETRACE_ENABLED /* 0x4 */
          if( sqlite3WhereTrace&0x4 ){
            sqlite3DebugPrintf("New    %s cost=%-3d,%3d,%3d order=%c\n",
                wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsorted,
                isOrdered>=0 ? isOrdered+'0' : '?');
          }
#endif
        }else{
          /* Control reaches here if best-so-far path pTo=aTo[jj] covers the
          ** same set of loops and has the same isOrdered setting as the
          ** candidate path.  Check to see if the candidate should replace
          ** pTo or if the candidate should be skipped.
          **
          ** The conditional is an expanded vector comparison equivalent to:
          **   (pTo->rCost,pTo->nRow,pTo->rUnsorted) <= (rCost,nOut,rUnsorted)
          */
          if( pTo->rCost<rCost
           || (pTo->rCost==rCost
               && (pTo->nRow<nOut
                   || (pTo->nRow==nOut && pTo->rUnsorted<=rUnsorted)
                  )
              )
          ){
#ifdef WHERETRACE_ENABLED /* 0x4 */
            if( sqlite3WhereTrace&0x4 ){
              sqlite3DebugPrintf(
                  "Skip   %s cost=%-3d,%3d,%3d order=%c",
                  wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsorted,
                  isOrdered>=0 ? isOrdered+'0' : '?');
              sqlite3DebugPrintf("   vs %s cost=%-3d,%3d,%3d order=%c\n",
                  wherePathName(pTo, iLoop+1, 0), pTo->rCost, pTo->nRow,
                  pTo->rUnsorted, pTo->isOrdered>=0 ? pTo->isOrdered+'0' : '?');
            }
#endif
            /* Discard the candidate path from further consideration */
            testcase( pTo->rCost==rCost );
            continue;
          }
          testcase( pTo->rCost==rCost+1 );
          /* Control reaches here if the candidate path is better than the
          ** pTo path.  Replace pTo with the candidate. */
#ifdef WHERETRACE_ENABLED /* 0x4 */
          if( sqlite3WhereTrace&0x4 ){
            sqlite3DebugPrintf(
                "Update %s cost=%-3d,%3d,%3d order=%c",
                wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsorted,
                isOrdered>=0 ? isOrdered+'0' : '?');
            sqlite3DebugPrintf("  was %s cost=%-3d,%3d,%3d order=%c\n",
                wherePathName(pTo, iLoop+1, 0), pTo->rCost, pTo->nRow,
                pTo->rUnsorted, pTo->isOrdered>=0 ? pTo->isOrdered+'0' : '?');
          }
#endif
        }
        /* pWLoop is a winner.  Add it to the set of best so far */
        pTo->maskLoop = pFrom->maskLoop | pWLoop->maskSelf;
        pTo->revLoop = revMask;
        pTo->nRow = nOut;
        pTo->rCost = rCost;
        pTo->rUnsorted = rUnsorted;
        pTo->isOrdered = isOrdered;
        memcpy(pTo->aLoop, pFrom->aLoop, sizeof(WhereLoop*)*iLoop);
        pTo->aLoop[iLoop] = pWLoop;
        if( nTo>=mxChoice ){
          mxI = 0;
          mxCost = aTo[0].rCost;
          mxUnsorted = aTo[0].nRow;
          for(jj=1, pTo=&aTo[1]; jj<mxChoice; jj++, pTo++){
            if( pTo->rCost>mxCost
             || (pTo->rCost==mxCost && pTo->rUnsorted>mxUnsorted)
            ){
              mxCost = pTo->rCost;
              mxUnsorted = pTo->rUnsorted;
              mxI = jj;
            }
          }
        }
      }
    }

#ifdef WHERETRACE_ENABLED  /* >=2 */
    if( sqlite3WhereTrace & 0x02 ){
      sqlite3DebugPrintf("---- after round %d ----\n", iLoop);
      for(ii=0, pTo=aTo; ii<nTo; ii++, pTo++){
        sqlite3DebugPrintf(" %s cost=%-3d nrow=%-3d order=%c",
           wherePathName(pTo, iLoop+1, 0), pTo->rCost, pTo->nRow,
           pTo->isOrdered>=0 ? (pTo->isOrdered+'0') : '?');
        if( pTo->isOrdered>0 ){
          sqlite3DebugPrintf(" rev=0x%llx\n", pTo->revLoop);
        }else{
          sqlite3DebugPrintf("\n");
        }
      }
    }
#endif

    /* Swap the roles of aFrom and aTo for the next generation */
    pFrom = aTo;
    aTo = aFrom;
    aFrom = pFrom;
    nFrom = nTo;
  }

  if( nFrom==0 ){
    sqlite3ErrorMsg(pParse, "no query solution");
    sqlite3StackFreeNN(pParse->db, pSpace);
    return SQLITE_ERROR;
  }

  /* Find the lowest cost path.  pFrom will be left pointing to that path */
  pFrom = aFrom;
  for(ii=1; ii<nFrom; ii++){
    if( pFrom->rCost>aFrom[ii].rCost ) pFrom = &aFrom[ii];
  }
  assert( pWInfo->nLevel==nLoop );
  /* Load the lowest cost path into pWInfo */
  for(iLoop=0; iLoop<nLoop; iLoop++){
    WhereLevel *pLevel = pWInfo->a + iLoop;
    pLevel->pWLoop = pWLoop = pFrom->aLoop[iLoop];
    pLevel->iFrom = pWLoop->iTab;
    pLevel->iTabCur = pWInfo->pTabList->a[pLevel->iFrom].iCursor;
  }
  if( (pWInfo->wctrlFlags & WHERE_WANT_DISTINCT)!=0
   && (pWInfo->wctrlFlags & WHERE_DISTINCTBY)==0
   && pWInfo->eDistinct==WHERE_DISTINCT_NOOP
   && nRowEst
  ){
    Bitmask notUsed;
    int rc = wherePathSatisfiesOrderBy(pWInfo, pWInfo->pResultSet, pFrom,
                 WHERE_DISTINCTBY, nLoop-1, pFrom->aLoop[nLoop-1], &notUsed);
    if( rc==pWInfo->pResultSet->nExpr ){
      pWInfo->eDistinct = WHERE_DISTINCT_ORDERED;
    }
  }
  pWInfo->bOrderedInnerLoop = 0;
  if( pWInfo->pOrderBy ){
    pWInfo->nOBSat = pFrom->isOrdered;
    if( pWInfo->wctrlFlags & WHERE_DISTINCTBY ){
      if( pFrom->isOrdered==pWInfo->pOrderBy->nExpr ){
        pWInfo->eDistinct = WHERE_DISTINCT_ORDERED;
      }
      /* vvv--- See check-in [12ad822d9b827777] on 2023-03-16 ---vvv */
      assert( pWInfo->pSelect->pOrderBy==0
           || pWInfo->nOBSat <= pWInfo->pSelect->pOrderBy->nExpr );
    }else{
      pWInfo->revMask = pFrom->revLoop;
      if( pWInfo->nOBSat<=0 ){
        pWInfo->nOBSat = 0;
        if( nLoop>0 ){
          u32 wsFlags = pFrom->aLoop[nLoop-1]->wsFlags;
          if( (wsFlags & WHERE_ONEROW)==0
           && (wsFlags&(WHERE_IPK|WHERE_COLUMN_IN))!=(WHERE_IPK|WHERE_COLUMN_IN)
          ){
            Bitmask m = 0;
            int rc = wherePathSatisfiesOrderBy(pWInfo, pWInfo->pOrderBy, pFrom,
                      WHERE_ORDERBY_LIMIT, nLoop-1, pFrom->aLoop[nLoop-1], &m);
            testcase( wsFlags & WHERE_IPK );
            testcase( wsFlags & WHERE_COLUMN_IN );
            if( rc==pWInfo->pOrderBy->nExpr ){
              pWInfo->bOrderedInnerLoop = 1;
              pWInfo->revMask = m;
            }
          }
        }
      }else if( nLoop
            && pWInfo->nOBSat==1
            && (pWInfo->wctrlFlags & (WHERE_ORDERBY_MIN|WHERE_ORDERBY_MAX))!=0
            ){
        pWInfo->bOrderedInnerLoop = 1;
      }
    }
    if( (pWInfo->wctrlFlags & WHERE_SORTBYGROUP)
        && pWInfo->nOBSat==pWInfo->pOrderBy->nExpr && nLoop>0
    ){
      Bitmask revMask = 0;
      int nOrder = wherePathSatisfiesOrderBy(pWInfo, pWInfo->pOrderBy,
          pFrom, 0, nLoop-1, pFrom->aLoop[nLoop-1], &revMask
      );
      assert( pWInfo->sorted==0 );
      if( nOrder==pWInfo->pOrderBy->nExpr ){
        pWInfo->sorted = 1;
        pWInfo->revMask = revMask;
      }
    }
  }

  pWInfo->nRowOut = pFrom->nRow;

  /* Free temporary memory and return success */
  sqlite3StackFreeNN(pParse->db, pSpace);
  return SQLITE_OK;
}